

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeHandler.cpp
# Opt level: O0

void __thiscall
Js::DynamicTypeHandler::SetAuxSlot
          (DynamicTypeHandler *this,DynamicObject *instance,PropertyId propertyId,bool allowLetConst
          ,int index,Var value)

{
  code *pcVar1;
  bool bVar2;
  uint16 uVar3;
  int iVar4;
  uint uVar5;
  undefined4 *puVar6;
  WriteBarrierPtr<void> **ppWVar7;
  Var value_local;
  int index_local;
  bool allowLetConst_local;
  PropertyId propertyId_local;
  DynamicObject *instance_local;
  DynamicTypeHandler *this_local;
  
  bVar2 = ThreadContext::IsOnStack(instance);
  if (((!bVar2) && (bVar2 = ThreadContext::IsOnStack(value), bVar2)) &&
     (bVar2 = TaggedNumber::Is(value), !bVar2)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/TypeHandler.cpp"
                                ,0xaf,
                                "(ThreadContext::IsOnStack(instance) || !ThreadContext::IsOnStack(value) || TaggedNumber::Is(value))"
                                ,
                                "ThreadContext::IsOnStack(instance) || !ThreadContext::IsOnStack(value) || TaggedNumber::Is(value)"
                               );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  iVar4 = GetSlotCapacity(this);
  uVar3 = GetInlineSlotCapacity(this);
  if ((int)(iVar4 - (uint)uVar3) <= index) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/TypeHandler.cpp"
                                ,0xb0,"(index < GetSlotCapacity() - GetInlineSlotCapacity())",
                                "index < GetSlotCapacity() - GetInlineSlotCapacity()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  if ((propertyId != -1) &&
     (uVar5 = (*this->_vptr_DynamicTypeHandler[0x56])
                        (this,instance,(ulong)(uint)propertyId,(ulong)allowLetConst),
     (uVar5 & 1) == 0)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/TypeHandler.cpp"
                                ,0xb1,
                                "(propertyId == Constants::NoProperty || CanStorePropertyValueDirectly(instance, propertyId, allowLetConst))"
                                ,
                                "propertyId == Constants::NoProperty || CanStorePropertyValueDirectly(instance, propertyId, allowLetConst)"
                               );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  ppWVar7 = Memory::WriteBarrierPtr::operator_cast_to_WriteBarrierPtr__
                      ((WriteBarrierPtr *)&instance->auxSlots);
  Memory::WriteBarrierPtr<void>::operator=(*ppWVar7 + index,value);
  return;
}

Assistant:

void DynamicTypeHandler::SetAuxSlot(DynamicObject* instance, int index, Var value)
#endif
    {
        // We should only assign a stack value only to a stack object (current mark temp number in mark temp object)
        Assert(ThreadContext::IsOnStack(instance) || !ThreadContext::IsOnStack(value) || TaggedNumber::Is(value));
        Assert(index < GetSlotCapacity() - GetInlineSlotCapacity());
        Assert(propertyId == Constants::NoProperty || CanStorePropertyValueDirectly(instance, propertyId, allowLetConst));
        instance->auxSlots[index] = value;
    }